

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSResolveResultEnum
js_resolve_export1(JSContext *ctx,JSModuleDef **pmodule,JSExportEntry **pme,JSModuleDef *m,
                  JSAtom export_name,JSResolveState *s)

{
  JSResolveEntry *pJVar1;
  JSAtomStruct *pJVar2;
  int iVar3;
  JSResolveResultEnum JVar4;
  JSAtom *pJVar5;
  JSExportEntry *pJVar6;
  JSExportEntry **ppJVar7;
  ulong uVar8;
  long lVar9;
  JSExportEntry **ppJVar10;
  JSAtom export_name_00;
  ulong uVar11;
  JSResolveState *pJVar12;
  bool bVar13;
  JSExportEntry *local_40;
  JSModuleDef *local_38;
  
  uVar11 = (ulong)export_name;
  pJVar12 = s;
  do {
    *pmodule = (JSModuleDef *)0x0;
    *pme = (JSExportEntry *)0x0;
    iVar3 = s->count;
    export_name_00 = (JSAtom)uVar11;
    if (0 < (long)iVar3) {
      pJVar5 = &s->array->name;
      uVar8 = 0;
      do {
        bVar13 = true;
        if ((((JSResolveEntry *)(pJVar5 + -2))->module == m) && (*pJVar5 == export_name_00)) {
          bVar13 = false;
          pJVar12 = (JSResolveState *)(uVar8 & 0xffffffff);
        }
        if (!bVar13) goto LAB_00137a9d;
        uVar8 = uVar8 + 1;
        pJVar5 = pJVar5 + 4;
      } while ((long)iVar3 != uVar8);
      pJVar12 = (JSResolveState *)0xffffffff;
LAB_00137a9d:
      if (-1 < (int)pJVar12) {
        return JS_RESOLVE_RES_CIRCULAR;
      }
    }
    if ((s->size <= iVar3) &&
       (iVar3 = js_realloc_array(ctx,&s->array,0x10,&s->size,iVar3 + 1), iVar3 != 0)) {
      return JS_RESOLVE_RES_EXCEPTION;
    }
    pJVar1 = s->array;
    iVar3 = s->count;
    s->count = iVar3 + 1;
    pJVar1[iVar3].module = m;
    if (0xd1 < (int)export_name_00) {
      pJVar2 = ctx->rt->atom_array[uVar11];
      (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
    }
    pJVar1[iVar3].name = export_name_00;
    lVar9 = (long)m->export_entries_count;
    if (0 < lVar9) {
      pJVar6 = m->export_entries;
      do {
        if (pJVar6->export_name == export_name_00) goto LAB_00137b00;
        pJVar6 = pJVar6 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    pJVar6 = (JSExportEntry *)0x0;
LAB_00137b00:
    if (pJVar6 == (JSExportEntry *)0x0) {
      if (export_name_00 == 0x16) goto LAB_00137c56;
      JVar4 = JS_RESOLVE_RES_FOUND;
      if (m->star_export_entries_count < 1) goto LAB_00137c3d;
      lVar9 = 0;
      ppJVar10 = pme;
      break;
    }
    if ((pJVar6->export_type == JS_EXPORT_TYPE_LOCAL) ||
       (uVar11 = (ulong)pJVar6->local_name, pJVar6->local_name == 0x7d)) {
      *pmodule = m;
      *pme = pJVar6;
      return JS_RESOLVE_RES_FOUND;
    }
    m = m->req_module_entries[(pJVar6->u).local.var_idx].module;
  } while( true );
LAB_00137b89:
  JVar4 = js_resolve_export1(ctx,&local_38,&local_40,
                             m->req_module_entries[m->star_export_entries[lVar9].req_module_idx].
                             module,export_name_00,s);
  ppJVar7 = (JSExportEntry **)(ulong)(uint)JVar4;
  bVar13 = false;
  if ((JVar4 != JS_RESOLVE_RES_EXCEPTION) && (JVar4 != JS_RESOLVE_RES_AMBIGUOUS)) {
    if (JVar4 == JS_RESOLVE_RES_FOUND) {
      if (*pme == (JSExportEntry *)0x0) {
        *pmodule = local_38;
        *pme = local_40;
      }
      else if ((*pmodule != local_38) || (local_40->local_name != (*pme)->local_name)) {
        bVar13 = false;
        *pmodule = (JSModuleDef *)0x0;
        *pme = (JSExportEntry *)0x0;
        ppJVar7 = (JSExportEntry **)0x3;
        goto LAB_00137c1d;
      }
    }
    bVar13 = true;
    ppJVar7 = (JSExportEntry **)((ulong)ppJVar10 & 0xffffffff);
  }
LAB_00137c1d:
  JVar4 = (JSResolveResultEnum)ppJVar7;
  if (!bVar13) {
    bVar13 = false;
    goto LAB_00137c52;
  }
  lVar9 = lVar9 + 1;
  ppJVar10 = ppJVar7;
  if (m->star_export_entries_count <= lVar9) {
LAB_00137c3d:
    bVar13 = *pme == (JSExportEntry *)0x0;
    if (!bVar13) {
      JVar4 = JS_RESOLVE_RES_FOUND;
    }
LAB_00137c52:
    if (bVar13) {
LAB_00137c56:
      JVar4 = JS_RESOLVE_RES_NOT_FOUND;
    }
    return JVar4;
  }
  goto LAB_00137b89;
}

Assistant:

static JSResolveResultEnum js_resolve_export1(JSContext *ctx,
                                              JSModuleDef **pmodule,
                                              JSExportEntry **pme,
                                              JSModuleDef *m,
                                              JSAtom export_name,
                                              JSResolveState *s)
{
    JSExportEntry *me;

    *pmodule = NULL;
    *pme = NULL;
    if (find_resolve_entry(s, m, export_name) >= 0)
        return JS_RESOLVE_RES_CIRCULAR;
    if (add_resolve_entry(ctx, s, m, export_name) < 0)
        return JS_RESOLVE_RES_EXCEPTION;
    me = find_export_entry(ctx, m, export_name);
    if (me) {
        if (me->export_type == JS_EXPORT_TYPE_LOCAL) {
            /* local export */
            *pmodule = m;
            *pme = me;
            return JS_RESOLVE_RES_FOUND;
        } else {
            /* indirect export */
            JSModuleDef *m1;
            m1 = m->req_module_entries[me->u.req_module_idx].module;
            if (me->local_name == JS_ATOM__star_) {
                /* export ns from */
                *pmodule = m;
                *pme = me;
                return JS_RESOLVE_RES_FOUND;
            } else {
                return js_resolve_export1(ctx, pmodule, pme, m1,
                                          me->local_name, s);
            }
        }
    } else {
        if (export_name != JS_ATOM_default) {
            /* not found in direct or indirect exports: try star exports */
            int i;

            for(i = 0; i < m->star_export_entries_count; i++) {
                JSStarExportEntry *se = &m->star_export_entries[i];
                JSModuleDef *m1, *res_m;
                JSExportEntry *res_me;
                JSResolveResultEnum ret;

                m1 = m->req_module_entries[se->req_module_idx].module;
                ret = js_resolve_export1(ctx, &res_m, &res_me, m1,
                                         export_name, s);
                if (ret == JS_RESOLVE_RES_AMBIGUOUS ||
                    ret == JS_RESOLVE_RES_EXCEPTION) {
                    return ret;
                } else if (ret == JS_RESOLVE_RES_FOUND) {
                    if (*pme != NULL) {
                        if (*pmodule != res_m ||
                            res_me->local_name != (*pme)->local_name) {
                            *pmodule = NULL;
                            *pme = NULL;
                            return JS_RESOLVE_RES_AMBIGUOUS;
                        }
                    } else {
                        *pmodule = res_m;
                        *pme = res_me;
                    }
                }
            }
            if (*pme != NULL)
                return JS_RESOLVE_RES_FOUND;
        }
        return JS_RESOLVE_RES_NOT_FOUND;
    }
}